

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteFlat<double,double,duckdb::UnaryOperatorWrapper,duckdb::RadiansOperator>
               (double *ldata,double *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  bool bVar1;
  idx_t iVar2;
  TemplatedValidityMask<unsigned_long> *input;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  double dVar3;
  idx_t i;
  byte in_stack_00000008;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff88;
  void *dataptr_00;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  unsigned_long local_58;
  idx_t in_stack_ffffffffffffffb0;
  ulong uVar4;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffc0;
  TemplatedValidityMask<unsigned_long> *mask_00;
  TemplatedValidityMask<unsigned_long> *pTVar5;
  TemplatedValidityMask<unsigned_long> *pTVar6;
  
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + (long)in_RDX * 8),in_RSI,
             (void *)((long)in_RSI + (long)in_RDX * 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/unary_executor.hpp"
             ,0x62);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_RCX);
  if (bVar1) {
    for (dataptr_00 = (void *)0x0; dataptr_00 < in_RDX; dataptr_00 = (void *)((long)dataptr_00 + 1))
    {
      dVar3 = UnaryOperatorWrapper::Operation<duckdb::RadiansOperator,double,double>
                        (in_stack_ffffffffffffffa0,(ValidityMask *)in_stack_ffffffffffffff98,
                         (idx_t)in_stack_ffffffffffffff90,dataptr_00);
      *(double *)((long)in_RSI + (long)dataptr_00 * 8) = dVar3;
    }
  }
  else {
    if ((in_stack_00000008 & 1) == 0) {
      TemplatedValidityMask<unsigned_long>::Initialize
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    }
    mask_00 = (TemplatedValidityMask<unsigned_long> *)0x0;
    iVar2 = TemplatedValidityMask<unsigned_long>::EntryCount(0x20bf3ae);
    for (uVar4 = 0; uVar4 < iVar2; uVar4 = uVar4 + 1) {
      local_58 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90);
      input = (TemplatedValidityMask<unsigned_long> *)
              MinValue<unsigned_long>((unsigned_long)(mask_00 + 2),(unsigned_long)in_RDX);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_58);
      if (bVar1) {
        for (; pTVar6 = mask_00, mask_00 < input;
            mask_00 = (TemplatedValidityMask<unsigned_long> *)((long)&mask_00->validity_mask + 1)) {
          dVar3 = UnaryOperatorWrapper::Operation<duckdb::RadiansOperator,double,double>
                            ((double)input,(ValidityMask *)in_stack_ffffffffffffff98,
                             (idx_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          *(double *)((long)in_RSI + (long)mask_00 * 8) = dVar3;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_58);
        pTVar5 = mask_00;
        pTVar6 = input;
        if (!bVar1) {
          for (; in_stack_ffffffffffffff98 = mask_00, pTVar6 = pTVar5, pTVar5 < input;
              pTVar5 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar5->validity_mask + 1)) {
            in_stack_ffffffffffffff90 =
                 (TemplatedValidityMask<unsigned_long> *)((long)pTVar5 - (long)mask_00);
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (&local_58,(idx_t *)&stack0xffffffffffffff90);
            if (bVar1) {
              dVar3 = UnaryOperatorWrapper::Operation<duckdb::RadiansOperator,double,double>
                                ((double)input,(ValidityMask *)mask_00,
                                 (idx_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
              *(double *)((long)in_RSI + (long)pTVar5 * 8) = dVar3;
            }
          }
        }
      }
      mask_00 = pTVar6;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}